

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

char * sysbvm_system_getArchitectureName(void)

{
  return "x86_64";
}

Assistant:

SYSBVM_API const char *sysbvm_system_getArchitectureName(void)
{
#if defined(__i386__) || defined(_M_IX86)
    return "x86";
#elif defined(__x86_64__) || defined(_M_X64)
    return "x86_64";
#elif defined(__arm__) || defined(_M_ARM)
    return "arm";
#elif defined(__aarch64__)
    return "aarch64";
#else
    #error "Unsupported architecture."
#endif
}